

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void armci_msg_snd(int tag,void *buffer,int len,int to)

{
  int iVar1;
  MPI_Comm poVar2;
  int flag;
  int self;
  MPI_Request request;
  MPI_Status status;
  int local_48;
  int local_44;
  MPI_Request local_40;
  undefined1 local_38 [24];
  
  poVar2 = wc();
  local_48 = 0;
  iVar1 = MPI_Comm_rank(poVar2,&local_44);
  if (iVar1 != 0) {
    __assert_fail("MPI_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x16c,"void armci_msg_snd(int, void *, int, int)");
  }
  if (tag != 0x6be8) {
    poVar2 = wc();
    iVar1 = MPI_Isend(buffer,len,&ompi_mpi_char,to,tag,poVar2,&local_40);
    if (iVar1 != 0) {
      __assert_fail("MPI_SUCCESS == rc",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x171,"void armci_msg_snd(int, void *, int, int)");
    }
    if (local_44 == to) {
      if (self_request_flag == '\x01') {
        __assert_fail("!self_request_flag",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                      ,0x175,"void armci_msg_snd(int, void *, int, int)");
      }
      self_request_flag = '\x01';
      self_request = local_40;
    }
    else {
      do {
        MPI_Test(&local_40,&local_48,local_38);
        comex_make_progress();
      } while (local_48 == 0);
    }
    return;
  }
  __assert_fail("COMEX_TAG != tag",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                ,0x16e,"void armci_msg_snd(int, void *, int, int)");
}

Assistant:

void armci_msg_snd(int tag, void* buffer, int len, int to)
{
    MPI_Comm comm = wc();
    MPI_Request request;
    MPI_Status status;
    int self;
    int flag = 0;
    int rc;

    rc = MPI_Comm_rank(comm, &self);
    assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
    assert(COMEX_TAG != tag);
#endif
    rc = MPI_Isend(buffer, len, MPI_CHAR, to, tag, wc(), &request);
    assert(MPI_SUCCESS == rc);
    if (to == self) {
        /* make sure this proc hasn't already sent to itself -- we only allow
         * one outstanding self send */
        assert(!self_request_flag);
        self_request_flag = 1;
        self_request = request;
    }
    else {
        do {
            MPI_Test(&request, &flag, &status);
            assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
            comex_make_progress();
#endif
        } while (!flag);
    }
}